

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O3

void __thiscall helics::udp::UdpComms::queue_rx_function(UdpComms *this)

{
  io_context *owner;
  ushort uVar1;
  int iVar2;
  int *__s;
  size_t sVar3;
  socklen_t __len;
  executor_type *peVar4;
  int __oflag;
  sockaddr *__addr;
  value_type *__val;
  string_view message;
  string local_290;
  _Any_data *local_270;
  error_code error;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  error_code ignored_error;
  endpoint remote_endp;
  ActionMessage reply;
  ActionMessage cmd;
  socket socket;
  undefined6 uVar5;
  
  if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
    iVar2 = std::future<int>::get(&this->futurePort);
    LOCK();
    (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar2;
    UNLOCK();
  }
  if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
    CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
    return;
  }
  cmd.source_id.gid = 0;
  cmd.source_handle.hid = 0;
  cmd._16_8_ = cmd._16_8_ & 0xffffffffffffff00;
  cmd._0_8_ = &cmd.dest_id;
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)&ioctx,(string *)&cmd);
  if ((GlobalFederateId *)cmd._0_8_ != &cmd.dest_id) {
    operator_delete((void *)cmd._0_8_,cmd._16_8_ + 1);
  }
  owner = ((ioctx.
            super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->ictx)._M_t.
          super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
          super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
          super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
  cmd._0_8_ = &asio::detail::typeid_wrapper<asio::detail::reactive_socket_service<asio::ip::udp>>::
               typeinfo;
  cmd.source_id.gid = 0;
  cmd.source_handle.hid = 0;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.service_ =
       (service_type *)
       asio::detail::service_registry::do_use_service
                 ((owner->super_execution_context).service_registry_,(key *)&cmd,
                  asio::detail::service_registry::
                  create<asio::detail::reactive_socket_service<asio::ip::udp>,asio::io_context>,
                  owner);
  peVar4 = &socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.protocol_.
  family_ = 2;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.target_fns_ =
       (target_fns *)
       asio::execution::detail::any_executor_base::
       target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(bool,std::enable_if<!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value,void>::type*)
       ::fns_with_execute;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.object_fns_ =
       (object_fns *)
       asio::execution::detail::any_executor_base::
       object_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(std::enable_if<(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value)&&(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,asio::execution::detail::shared_target_executor>::value),void>::type*)
       ::fns;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .prop_fns_ = (prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)asio::execution::
                  any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
                  ::
                  prop_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>()
                  ::fns;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.socket_ = -1;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.state_ = '\0';
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.reactor_data_ = (per_descriptor_data)0x0;
  cmd.messageAction =
       (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) * 8
       + cmd_user_disconnect;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.object_.data._0_8_ = owner;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.target_ = peVar4;
  asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::open
            (&socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>,(char *)&cmd,__oflag);
  local_270 = (_Any_data *)0x0;
  uVar5 = (undefined6)((ulong)peVar4 >> 0x10);
  __len = (socklen_t)CONCAT62(uVar5,2);
  if ((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) {
    __len = (socklen_t)CONCAT62(uVar5,10);
  }
  cmd.counter = 0;
  cmd.flags = 0;
  cmd.dest_id.gid = 0;
  cmd.dest_handle.hid = 0;
  cmd.source_id.gid = 0;
  cmd.source_handle.hid = 0;
  uVar1 = (ushort)(this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
  cmd.messageAction._2_2_ = uVar1 << 8 | uVar1 >> 8;
  cmd.messageAction._0_2_ = (short)__len;
  cmd.messageID = 0;
  asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::bind
            (&socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>,(int)&cmd,__addr,__len
            );
  __s = (int *)operator_new(0x27d0);
  memset(__s,0,0x27d0);
  remote_endp.impl_.data_.v6.sin6_scope_id = 0;
  remote_endp.impl_.data_._8_1_ = '\0';
  remote_endp.impl_.data_._9_1_ = '\0';
  remote_endp.impl_.data_._10_1_ = '\0';
  remote_endp.impl_.data_._11_1_ = '\0';
  remote_endp.impl_.data_._12_1_ = '\0';
  remote_endp.impl_.data_._13_1_ = '\0';
  remote_endp.impl_.data_._14_1_ = '\0';
  remote_endp.impl_.data_._15_1_ = '\0';
  remote_endp.impl_.data_._16_8_ = 0;
  remote_endp.impl_.data_._0_8_ = 2;
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  ignored_error._M_value = 0;
  ignored_error._M_cat = error._M_cat;
  CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
  local_270 = (_Any_data *)&(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback;
  do {
    cmd.source_id.gid = 0x27d0;
    cmd.source_handle.hid = 0;
    cmd._0_8_ = __s;
    sVar3 = asio::detail::reactive_socket_service<asio::ip::udp>::
            receive_from<asio::mutable_buffers_1>
                      (socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                       service_,&socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.
                                 impl_.implementation_,(mutable_buffers_1 *)&cmd,&remote_endp,0,
                       &error);
    if (error._M_value != 0) {
      CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
LAB_0025020e:
      operator_delete(__s,0x27d0);
      asio::detail::
      io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
      ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
                       *)&socket);
      if (ioctx.super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ioctx.
                   super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
    if ((sVar3 == 5) && ((char)__s[1] == 'e' && *__s == 0x736f6c63)) {
LAB_002501f9:
      LOCK();
      (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
      UNLOCK();
      CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
      goto LAB_0025020e;
    }
    ActionMessage::ActionMessage(&cmd,__s,sVar3);
    if (cmd.messageAction < cmd_invalid) {
      if ((cmd.messageAction == cmd_protocol_priority) || (cmd.messageAction == cmd_protocol)) {
LAB_002500d4:
        if (cmd.messageID != 0x16570bf) {
          NetworkCommsInterface::generateReplyToIncomingMessage
                    (&reply,&this->super_NetworkCommsInterface,&cmd);
          if (reply.messageID != 0x9db) {
            if (reply.messageAction != cmd_ignore) {
              ActionMessage::to_string_abi_cxx11_(&local_290,&reply);
              sVar3 = 0x1c;
              if (remote_endp.impl_.data_.base.sa_family == 2) {
                sVar3 = 0x10;
              }
              asio::detail::socket_ops::sync_sendto1
                        (socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                         implementation_.super_base_implementation_type.socket_,
                         socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                         implementation_.super_base_implementation_type.state_,
                         local_290._M_dataplus._M_p,local_290._M_string_length,0,&remote_endp,sVar3,
                         &ignored_error);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._M_dataplus._M_p != &local_290.field_2) {
                operator_delete(local_290._M_dataplus._M_p,
                                local_290.field_2._M_allocated_capacity + 1);
              }
            }
            ActionMessage::~ActionMessage(&reply);
            goto LAB_002501a5;
          }
          ActionMessage::~ActionMessage(&reply);
        }
        ActionMessage::~ActionMessage(&cmd);
        goto LAB_002501f9;
      }
LAB_00250189:
      if ((this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback.
          super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback._M_invoker)
                (local_270,&cmd);
    }
    else {
      if (cmd.messageAction == cmd_protocol_big) goto LAB_002500d4;
      if (cmd.messageAction != cmd_invalid) goto LAB_00250189;
      message._M_str = "invalid command received udp";
      message._M_len = 0x1c;
      CommsInterface::logWarning((CommsInterface *)this,message);
    }
LAB_002501a5:
    ActionMessage::~ActionMessage(&cmd);
  } while( true );
}

Assistant:

void UdpComms::queue_rx_function()
{
    using gmlc::networking::makePortAddress;

    if (PortNumber < 0) {
        PortNumber = futurePort.get();
    }
    if (PortNumber < 0) {
        setRxStatus(ConnectionStatus::ERRORED);
        return;
    }
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    udp::socket socket(ioctx->getBaseContext());
    socket.open(udpnet(interfaceNetwork));
    std::chrono::milliseconds t_cnt{0};
    bool bindsuccess = false;
    while (!bindsuccess) {
        try {
            socket.bind(udp::endpoint(udpnet(interfaceNetwork), static_cast<uint16_t>(PortNumber)));
            bindsuccess = true;
        }
        catch (const std::system_error& error) {
            if ((autoPortNumber) &&
                (hasBroker)) {  // If we failed and we are on an automatically assigned port
                                // number,  just try a different port
                int tries = 0;
                while (!bindsuccess) {
                    ++PortNumber;
                    try {
                        socket.bind(udp::endpoint(udpnet(interfaceNetwork),
                                                  static_cast<uint16_t>(PortNumber)));
                        bindsuccess = true;
                    }
                    catch (const std::system_error&) {
                        ++tries;
                        if (tries > 10) {
                            break;
                        }
                    }
                }
                if (!bindsuccess) {
                    disconnecting = true;
                    logError(fmt::format("unable to bind socket {} :{}",
                                         makePortAddress(localTargetAddress, PortNumber),
                                         error.what()));
                    socket.close();
                    setRxStatus(ConnectionStatus::ERRORED);
                    return;
                }
                continue;
            }
            if (t_cnt == std::chrono::milliseconds(0)) {
                logWarning(fmt::format("bind error on UDP socket {} :{}",
                                       makePortAddress(localTargetAddress, PortNumber),
                                       error.what()));
            }
            std::this_thread::sleep_for(std::chrono::milliseconds(200));
            t_cnt += std::chrono::milliseconds(200);
            if (t_cnt > connectionTimeout) {
                disconnecting = true;
                logError(fmt::format("unable to bind socket {} :{}",
                                     makePortAddress(localTargetAddress, PortNumber),
                                     error.what()));
                socket.close();
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
    }

    std::vector<char> data(10192);
    udp::endpoint remote_endp;
    std::error_code error;
    std::error_code ignored_error;
    setRxStatus(ConnectionStatus::CONNECTED);
    while (true) {
        auto len = socket.receive_from(asio::buffer(data), remote_endp, 0, error);
        if (error) {
            setRxStatus(ConnectionStatus::ERRORED);
            return;
        }
        if (len == 5) {
            const std::string_view str(data.data(), len);
            if (str == "close") {
                break;
            }
        }
        ActionMessage cmd(reinterpret_cast<std::byte*>(data.data()), len);
        if (!isValidCommand(cmd)) {
            logWarning("invalid command received udp");
            continue;
        }
        if (isProtocolCommand(cmd)) {
            if (cmd.messageID == CLOSE_RECEIVER) {
                break;
            }
            auto reply = generateReplyToIncomingMessage(cmd);
            if (reply.messageID == DISCONNECT) {
                break;
            }
            if (reply.action() != CMD_IGNORE) {
                socket.send_to(asio::buffer(reply.to_string()), remote_endp, 0, ignored_error);
            }
        } else {
            ActionCallback(std::move(cmd));
        }
    }
    disconnecting = true;
    setRxStatus(ConnectionStatus::TERMINATED);
}